

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

QString * __thiscall QMimeBinaryProvider::resolveAlias(QMimeBinaryProvider *this,QString *name)

{
  long lVar1;
  QLatin1StringView latin1;
  quint32 qVar2;
  int iVar3;
  quint32 qVar4;
  int iVar5;
  quint32 offset;
  pointer pCVar6;
  char *s;
  QString *in_RDI;
  long in_FS_OFFSET;
  char *mimeType;
  int mimeOffset;
  int cmp;
  char *alias;
  int aliasOffset;
  int off;
  int medium;
  int end;
  int begin;
  int numEntries;
  int aliasListOffset;
  QByteArray input;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  CacheFile *in_stack_ffffffffffffff10;
  quint32 qVar7;
  QString *pQVar8;
  int local_70;
  int local_6c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = in_RDI;
  QString::toLatin1((QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::
  unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>::
  operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
              *)0x8fabd2);
  CacheFile::getUint32(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  std::
  unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>::
  operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
              *)0x8fabfe);
  qVar2 = CacheFile::getUint32(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  local_6c = 0;
  local_70 = qVar2 - 1;
LAB_008fac3a:
  do {
    if (local_70 < local_6c) {
      QString::QString((QString *)0x8fae22);
LAB_008fae2a:
      QByteArray::~QByteArray((QByteArray *)0x8fae37);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    iVar3 = (local_6c + local_70) / 2;
    std::
    unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                  *)0x8fac99);
    qVar4 = CacheFile::getUint32(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    qVar7 = qVar4;
    pCVar6 = std::
             unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                           *)0x8facc4);
    CacheFile::getCharStar(pCVar6,qVar4);
    QByteArray::operator_cast_to_char_((QByteArray *)0x8facf8);
    iVar5 = qstrcmp((char *)in_stack_ffffffffffffff10,
                    (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (iVar5 < 0) {
      local_6c = iVar3 + 1;
      goto LAB_008fac3a;
    }
    if (iVar5 < 1) {
      std::
      unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                    *)0x8fad8e);
      offset = CacheFile::getUint32(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      qVar4 = offset;
      pCVar6 = std::
               unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
               ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                             *)0x8fadbc);
      s = CacheFile::getCharStar(pCVar6,offset);
      QLatin1String::QLatin1String((QLatin1String *)CONCAT44(iVar5,qVar4),s);
      latin1.m_size._4_4_ = qVar2;
      latin1.m_size._0_4_ = qVar7;
      latin1.m_data = (char *)pQVar8;
      QString::QString((QString *)CONCAT44(iVar5,qVar4),latin1);
      goto LAB_008fae2a;
    }
    local_70 = iVar3 + -1;
  } while( true );
}

Assistant:

QString QMimeBinaryProvider::resolveAlias(const QString &name)
{
    const QByteArray input = name.toLatin1();
    const int aliasListOffset = m_cacheFile->getUint32(PosAliasListOffset);
    const int numEntries = m_cacheFile->getUint32(aliasListOffset);
    int begin = 0;
    int end = numEntries - 1;
    while (begin <= end) {
        const int medium = (begin + end) / 2;
        const int off = aliasListOffset + 4 + 8 * medium;
        const int aliasOffset = m_cacheFile->getUint32(off);
        const char *alias = m_cacheFile->getCharStar(aliasOffset);
        const int cmp = qstrcmp(alias, input);
        if (cmp < 0) {
            begin = medium + 1;
        } else if (cmp > 0) {
            end = medium - 1;
        } else {
            const int mimeOffset = m_cacheFile->getUint32(off + 4);
            const char *mimeType = m_cacheFile->getCharStar(mimeOffset);
            return QLatin1StringView(mimeType);
        }
    }
    return QString();
}